

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise.cpp
# Opt level: O1

int __thiscall
ncnn::Eltwise::forward
          (Eltwise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  Mat *m;
  Mat *this_00;
  pointer pMVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  uint uVar13;
  void *pvVar14;
  void *pvVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  float fVar21;
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar3 = m->c;
  uVar18 = (ulong)uVar3;
  uVar13 = m->h * m->w * m->d;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  iVar4 = this->op_type;
  if (iVar4 == 2) {
    if (0 < (int)uVar3) {
      pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pvVar12 = m->data;
      sVar6 = m->cstep;
      pvVar14 = pMVar5[1].data;
      sVar7 = pMVar5[1].cstep;
      pvVar15 = this_00->data;
      sVar8 = this_00->cstep;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar5[1].elemsize;
      sVar11 = m->elemsize;
      uVar16 = 0;
      do {
        if (0 < (int)uVar13) {
          uVar20 = 0;
          do {
            fVar21 = *(float *)((long)pvVar14 + uVar20 * 4);
            fVar1 = *(float *)((long)pvVar12 + uVar20 * 4);
            if (fVar21 <= fVar1) {
              fVar21 = fVar1;
            }
            *(float *)((long)pvVar15 + uVar20 * 4) = fVar21;
            uVar20 = uVar20 + 1;
          } while (uVar13 != uVar20);
        }
        uVar16 = uVar16 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
        pvVar14 = (void *)((long)pvVar14 + sVar7 * sVar10);
        pvVar12 = (void *)((long)pvVar12 + sVar6 * sVar11);
      } while (uVar16 != uVar18);
    }
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 3) *
             -0x71c71c71c71c71c7;
    if (uVar16 < 3) {
      return 0;
    }
    uVar20 = 2;
    do {
      if (0 < (int)uVar3) {
        pvVar12 = pMVar5[uVar20].data;
        sVar6 = pMVar5[uVar20].cstep;
        sVar7 = pMVar5[uVar20].elemsize;
        pvVar14 = this_00->data;
        sVar8 = this_00->cstep;
        sVar9 = this_00->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar13) {
            uVar19 = 0;
            do {
              fVar21 = *(float *)((long)pvVar12 + uVar19 * 4);
              fVar1 = *(float *)((long)pvVar14 + uVar19 * 4);
              if (fVar21 <= fVar1) {
                fVar21 = fVar1;
              }
              *(float *)((long)pvVar14 + uVar19 * 4) = fVar21;
              uVar19 = uVar19 + 1;
            } while (uVar13 != uVar19);
          }
          uVar17 = uVar17 + 1;
          pvVar12 = (void *)((long)pvVar12 + sVar6 * sVar7);
          pvVar14 = (void *)((long)pvVar14 + sVar8 * sVar9);
        } while (uVar17 != uVar18);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar16);
  }
  else {
    if (iVar4 == 1) {
      if ((this->coeffs).w != 0) {
        if (0 < (int)uVar3) {
          uVar2 = *(this->coeffs).data;
          pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          pvVar12 = m->data;
          sVar6 = m->cstep;
          pvVar14 = pMVar5[1].data;
          sVar7 = pMVar5[1].cstep;
          pvVar15 = this_00->data;
          sVar8 = this_00->cstep;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar5[1].elemsize;
          sVar11 = m->elemsize;
          uVar16 = 0;
          do {
            if (0 < (int)uVar13) {
              uVar20 = 0;
              do {
                *(float *)((long)pvVar15 + uVar20 * 4) =
                     *(float *)((long)pvVar14 + uVar20 * 4) * (float)((ulong)uVar2 >> 0x20) +
                     *(float *)((long)pvVar12 + uVar20 * 4) * (float)uVar2;
                uVar20 = uVar20 + 1;
              } while (uVar13 != uVar20);
            }
            uVar16 = uVar16 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
            pvVar14 = (void *)((long)pvVar14 + sVar7 * sVar10);
            pvVar12 = (void *)((long)pvVar12 + sVar6 * sVar11);
          } while (uVar16 != uVar18);
        }
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar16 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 3) *
                 -0x71c71c71c71c71c7;
        if (uVar16 < 3) {
          return 0;
        }
        pvVar12 = (this->coeffs).data;
        uVar20 = 2;
        do {
          if (0 < (int)uVar3) {
            fVar21 = *(float *)((long)pvVar12 + uVar20 * 4);
            pvVar14 = pMVar5[uVar20].data;
            sVar6 = pMVar5[uVar20].cstep;
            sVar7 = pMVar5[uVar20].elemsize;
            pvVar15 = this_00->data;
            sVar8 = this_00->cstep;
            sVar9 = this_00->elemsize;
            uVar17 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar15 + uVar19 * 4) =
                       *(float *)((long)pvVar14 + uVar19 * 4) * fVar21 +
                       *(float *)((long)pvVar15 + uVar19 * 4);
                  uVar19 = uVar19 + 1;
                } while (uVar13 != uVar19);
              }
              uVar17 = uVar17 + 1;
              pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
              pvVar14 = (void *)((long)pvVar14 + sVar6 * sVar7);
            } while (uVar17 != uVar18);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar16);
        return 0;
      }
      if (0 < (int)uVar3) {
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar12 = m->data;
        sVar6 = m->cstep;
        pvVar14 = pMVar5[1].data;
        sVar7 = pMVar5[1].cstep;
        pvVar15 = this_00->data;
        sVar8 = this_00->cstep;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar5[1].elemsize;
        sVar11 = m->elemsize;
        uVar16 = 0;
        do {
          if (0 < (int)uVar13) {
            uVar20 = 0;
            do {
              *(float *)((long)pvVar15 + uVar20 * 4) =
                   *(float *)((long)pvVar14 + uVar20 * 4) + *(float *)((long)pvVar12 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar13 != uVar20);
          }
          uVar16 = uVar16 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
          pvVar14 = (void *)((long)pvVar14 + sVar7 * sVar10);
          pvVar12 = (void *)((long)pvVar12 + sVar6 * sVar11);
        } while (uVar16 != uVar18);
      }
      pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 3) *
               -0x71c71c71c71c71c7;
      if (uVar16 < 3) {
        return 0;
      }
      uVar20 = 2;
      do {
        if (0 < (int)uVar3) {
          pvVar12 = pMVar5[uVar20].data;
          sVar6 = pMVar5[uVar20].cstep;
          sVar7 = pMVar5[uVar20].elemsize;
          pvVar14 = this_00->data;
          sVar8 = this_00->cstep;
          sVar9 = this_00->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar13) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar14 + uVar19 * 4) =
                     *(float *)((long)pvVar14 + uVar19 * 4) + *(float *)((long)pvVar12 + uVar19 * 4)
                ;
                uVar19 = uVar19 + 1;
              } while (uVar13 != uVar19);
            }
            uVar17 = uVar17 + 1;
            pvVar14 = (void *)((long)pvVar14 + sVar8 * sVar9);
            pvVar12 = (void *)((long)pvVar12 + sVar6 * sVar7);
          } while (uVar17 != uVar18);
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar16);
      return 0;
    }
    if (iVar4 != 0) {
      return 0;
    }
    if (0 < (int)uVar3) {
      pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pvVar12 = m->data;
      sVar6 = m->cstep;
      pvVar14 = pMVar5[1].data;
      sVar7 = pMVar5[1].cstep;
      sVar8 = this_00->cstep;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar5[1].elemsize;
      pvVar15 = this_00->data;
      sVar11 = m->elemsize;
      uVar16 = 0;
      do {
        if (0 < (int)uVar13) {
          uVar20 = 0;
          do {
            *(float *)((long)pvVar15 + uVar20 * 4) =
                 *(float *)((long)pvVar14 + uVar20 * 4) * *(float *)((long)pvVar12 + uVar20 * 4);
            uVar20 = uVar20 + 1;
          } while (uVar13 != uVar20);
        }
        uVar16 = uVar16 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar9);
        pvVar14 = (void *)((long)pvVar14 + sVar7 * sVar10);
        pvVar12 = (void *)((long)pvVar12 + sVar6 * sVar11);
      } while (uVar16 != uVar18);
    }
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 3) *
             -0x71c71c71c71c71c7;
    if (uVar16 < 3) {
      return 0;
    }
    uVar20 = 2;
    do {
      if (0 < (int)uVar3) {
        pvVar12 = pMVar5[uVar20].data;
        sVar6 = pMVar5[uVar20].cstep;
        sVar7 = pMVar5[uVar20].elemsize;
        pvVar14 = this_00->data;
        sVar8 = this_00->cstep;
        sVar9 = this_00->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar13) {
            uVar19 = 0;
            do {
              *(float *)((long)pvVar14 + uVar19 * 4) =
                   *(float *)((long)pvVar14 + uVar19 * 4) * *(float *)((long)pvVar12 + uVar19 * 4);
              uVar19 = uVar19 + 1;
            } while (uVar13 != uVar19);
          }
          uVar17 = uVar17 + 1;
          pvVar14 = (void *)((long)pvVar14 + sVar8 * sVar9);
          pvVar12 = (void *)((long)pvVar12 + sVar6 * sVar7);
        } while (uVar17 != uVar18);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar16);
  }
  return 0;
}

Assistant:

int Eltwise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int size = w * h * d;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] * ptr1[i];
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] *= ptr[i];
                }
            }
        }
    }
    else if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = ptr[i] + ptr1[i];
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] += ptr[i];
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = ptr[i] * coeff0 + ptr1[i] * coeff1;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] += ptr[i] * coeff;
                    }
                }
            }
        }
    }
    else if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(ptr[i], ptr1[i]);
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], ptr[i]);
                }
            }
        }
    }

    return 0;
}